

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O0

void adh_update_tree(adh_node_t *node,_Bool is_new_node)

{
  adh_node_t *node2;
  adh_node_t *local_30;
  adh_node_t *node_to_swap;
  adh_node_t *node_to_check;
  _Bool is_new_node_local;
  adh_node_t *node_local;
  
  local_30 = node;
  if (is_new_node) {
    local_30 = node->parent;
  }
  for (node_to_swap = local_30; node_to_swap != (adh_node_t *)0x0 && node_to_swap != adh_root_node;
      node_to_swap = node_to_swap->parent) {
    node2 = find_higher_order_same_weight(node_to_swap->weight,node_to_swap->order);
    if (node2 != (adh_node_t *)0x0) {
      swap_nodes(node_to_swap,node2);
    }
    increase_weight(node_to_swap);
  }
  increase_weight(node_to_swap);
  return;
}

Assistant:

void adh_update_tree(adh_node_t *node, bool is_new_node) {
#ifdef _DEBUG
    log_debug("  adh_update_tree", "%s is_new=%d\n",
              fmt_node(node), is_new_node);
#endif

    // create node_to_check
    adh_node_t * node_to_check = is_new_node ? node->parent : node;
    while(node_to_check != NULL && node_to_check != adh_root_node) {
        // search in tree node with same weight and higher order
        adh_node_t * node_to_swap = find_higher_order_same_weight(node_to_check->weight,
                                                                  node_to_check->order);


        // if node_to_swap == NULL, then no swap is needed
        if (node_to_swap != NULL) {
#ifdef _DEBUG
            log_tree();
#endif
            swap_nodes(node_to_check, node_to_swap);
        }
        // now we can safely update the weight of the node
        increase_weight(node_to_check);

        // continue ascending the tree
        node_to_check = node_to_check->parent;
    }

    increase_weight(node_to_check);

#ifdef _DEBUG
    log_tree();
#endif
}